

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O3

void __thiscall
booster::locale::impl_icu::icu_calendar_facet::icu_calendar_facet
          (icu_calendar_facet *this,cdata *d,size_t refs)

{
  pointer pcVar1;
  
  *(uint *)&(this->super_calendar_facet).field_0x8 = (uint)(refs != 0);
  *(undefined ***)&this->super_calendar_facet = &PTR__icu_calendar_facet_001d0f20;
  icu_70::Locale::Locale(&(this->data_).locale,&d->locale);
  (this->data_).encoding._M_dataplus._M_p = (pointer)&(this->data_).encoding.field_2;
  pcVar1 = (d->encoding)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->data_).encoding,pcVar1,pcVar1 + (d->encoding)._M_string_length);
  (this->data_).utf8 = d->utf8;
  return;
}

Assistant:

icu_calendar_facet(cdata const &d,size_t refs = 0) : 
            calendar_facet(refs),
            data_(d)
        {
        }